

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

void __thiscall
pbrt::
InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
reserve(InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
        *this,size_t n)

{
  memory_resource *pmVar1;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  long lVar5;
  anon_union_192_1_a7e8d694_for_InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>_5
  *paVar6;
  Point3<float> *pPVar4;
  
  uVar3 = 0x10;
  if (this->ptr != (Point3<float> *)0x0) {
    uVar3 = this->nAlloc;
  }
  if (uVar3 < n) {
    pmVar1 = (this->alloc).memoryResource;
    iVar2 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 0xc,4);
    pPVar4 = (Point3<float> *)CONCAT44(extraout_var,iVar2);
    if (this->nStored != 0) {
      lVar5 = 0;
      uVar3 = 0;
      do {
        paVar6 = (anon_union_192_1_a7e8d694_for_InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>_5
                  *)this->ptr;
        if ((anon_union_192_1_a7e8d694_for_InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>_5
             *)this->ptr ==
            (anon_union_192_1_a7e8d694_for_InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>_5
             *)0x0) {
          paVar6 = &this->field_2;
        }
        *(undefined4 *)((long)&(pPVar4->super_Tuple3<pbrt::Point3,_float>).z + lVar5) =
             *(undefined4 *)((long)paVar6 + lVar5 + 8);
        *(undefined8 *)((long)&(pPVar4->super_Tuple3<pbrt::Point3,_float>).x + lVar5) =
             *(undefined8 *)((long)paVar6 + lVar5);
        uVar3 = uVar3 + 1;
        lVar5 = lVar5 + 0xc;
      } while (uVar3 < this->nStored);
    }
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc * 0xc,4);
    this->nAlloc = n;
    this->ptr = pPVar4;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (capacity() >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }